

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

FileDescriptorSet *
google::protobuf::Arena::CreateMaybeMessage<google::protobuf::FileDescriptorSet>(Arena *arena)

{
  FileDescriptorSet *this;
  
  if (arena == (Arena *)0x0) {
    this = (FileDescriptorSet *)operator_new(0x30);
    FileDescriptorSet::FileDescriptorSet(this);
  }
  else {
    if (arena->hooks_cookie_ != (void *)0x0) {
      OnArenaAllocation(arena,(type_info *)&FileDescriptorSet::typeinfo,0x30);
    }
    this = (FileDescriptorSet *)internal::ArenaImpl::AllocateAligned(&arena->impl_,0x30);
    FileDescriptorSet::FileDescriptorSet(this,arena);
  }
  return this;
}

Assistant:

static void InitDefaultsscc_info_SourceCodeInfo_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_SourceCodeInfo_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::SourceCodeInfo();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::SourceCodeInfo::InitAsDefaultInstance();
}